

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_3a2c68::Handlers::endOverlay(Handlers *this)

{
  __shared_ptr<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  QPDFJob::UOConfig::endUnderlayOverlay
            ((this->c_uo).super___shared_ptr<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_18._M_ptr = (element_type *)0x0;
  local_18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->c_uo).super___shared_ptr<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2>,
             &local_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
  return;
}

Assistant:

void
Handlers::endOverlay()
{
    c_uo->endUnderlayOverlay();
    c_uo = nullptr;
}